

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O0

ctmbstr tidyOptGetValue(TidyDoc tdoc,TidyOptionId optId)

{
  ulong uVar1;
  ctmbstr ptStack_28;
  uint pick;
  ctmbstr optval;
  TidyDocImpl *impl;
  TidyOptionId optId_local;
  TidyDoc tdoc_local;
  
  ptStack_28 = (ctmbstr)0x0;
  if (tdoc != (TidyDoc)0x0) {
    if (optId == TidyDoctype) {
      uVar1 = tidyOptGetInt(tdoc,TidyDoctypeMode);
      if ((uint)uVar1 == 5) {
        ptStack_28 = *(ctmbstr *)(tdoc + 0x36);
      }
      else {
        ptStack_28 = prvTidyGetPickListLabelForPick(TidyDoctypeMode,(uint)uVar1);
      }
    }
    else {
      ptStack_28 = *(ctmbstr *)(tdoc + (ulong)optId * 2 + 0x1c);
    }
  }
  return ptStack_28;
}

Assistant:

ctmbstr TIDY_CALL       tidyOptGetValue( TidyDoc tdoc, TidyOptionId optId )
{
    TidyDocImpl* impl = tidyDocToImpl( tdoc );
    ctmbstr optval = NULL;
    if ( impl )
    {
        if ( optId == TidyDoctype )
        {
            /* Special case for TidyDoctype, because it has a picklist and is a string. */
            uint pick = tidyOptGetInt( tdoc, TidyDoctypeMode );
            if ( pick != TidyDoctypeUser )
            {
                optval = TY_(GetPickListLabelForPick)( TidyDoctypeMode, pick );
            } else {
                optval = cfgStr( impl, optId );
            }
        } else {
            /* Standard case. */
            optval = cfgStr( impl, optId );
        }
    }
    return optval;
}